

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::CreateLinkLibs
          (cmMakefileTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *linkLibs,
          bool useResponseFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  cmMakefile *this_00;
  string *psVar1;
  long lVar2;
  string local_1a0;
  undefined1 local_180 [8];
  string link_rsp;
  char *responseFlag;
  allocator<char> local_131;
  undefined1 local_130 [8];
  string responseFlagVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  cmComputeLinkInformation *local_d0;
  cmComputeLinkInformation *pcli;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string config;
  string linkPath;
  string frameworkPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  bool useResponseFile_local;
  string *linkLibs_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmMakefileTargetGenerator *this_local;
  
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(config.field_2._M_local_buf + 8));
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"CMAKE_BUILD_TYPE",&local_b1);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_b0);
  std::__cxx11::string::string((string *)local_90,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_d0 = cmGeneratorTarget::GetLinkInformation
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)local_90);
  cmLocalGenerator::OutputLinkLibraries
            ((cmLocalGenerator *)this->LocalGenerator,local_d0,linkLineComputer,linkLibs,
             (string *)((long)&linkPath.field_2 + 8),(string *)((long)&config.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&responseFlagVar.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&config.field_2 + 8));
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&responseFlagVar.field_2 + 8),linkLibs);
  std::__cxx11::string::operator=((string *)linkLibs,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)(responseFlagVar.field_2._M_local_buf + 8));
  if (useResponseFile) {
    lVar2 = std::__cxx11::string::find_first_not_of((char)linkLibs,0x20);
    if (lVar2 != -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_130,"CMAKE_",&local_131);
      std::allocator<char>::~allocator(&local_131);
      cmGeneratorTarget::GetLinkerLanguage
                ((string *)&responseFlag,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 &(this->super_cmCommonTargetGenerator).ConfigName);
      std::__cxx11::string::operator+=((string *)local_130,(string *)&responseFlag);
      std::__cxx11::string::~string((string *)&responseFlag);
      std::__cxx11::string::operator+=((string *)local_130,"_RESPONSE_FILE_LINK_FLAG");
      link_rsp.field_2._8_8_ =
           cmMakefile::GetDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_130);
      if ((char *)link_rsp.field_2._8_8_ == (char *)0x0) {
        link_rsp.field_2._8_8_ = (long)"\\/@" + 2;
      }
      CreateResponseFile((string *)local_180,this,"linklibs.rsp",linkLibs,makefile_depends);
      std::__cxx11::string::operator=((string *)linkLibs,(char *)link_rsp.field_2._8_8_);
      cmOutputConverter::ConvertToOutputFormat
                (&local_1a0,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_180,SHELL);
      std::__cxx11::string::operator+=((string *)linkLibs,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)local_180);
      std::__cxx11::string::~string((string *)local_130);
    }
  }
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(config.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkLibs(
  cmLinkLineComputer* linkLineComputer, std::string& linkLibs,
  bool useResponseFile, std::vector<std::string>& makefile_depends)
{
  std::string frameworkPath;
  std::string linkPath;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli =
    this->GeneratorTarget->GetLinkInformation(config);
  this->LocalGenerator->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                            frameworkPath, linkPath);
  linkLibs = frameworkPath + linkPath + linkLibs;

  if (useResponseFile &&
      linkLibs.find_first_not_of(' ') != std::string::npos) {
    // Lookup the response file reference flag.
    std::string responseFlagVar = "CMAKE_";
    responseFlagVar +=
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    responseFlagVar += "_RESPONSE_FILE_LINK_FLAG";
    const char* responseFlag = this->Makefile->GetDefinition(responseFlagVar);
    if (!responseFlag) {
      responseFlag = "@";
    }

    // Create this response file.
    std::string link_rsp =
      this->CreateResponseFile("linklibs.rsp", linkLibs, makefile_depends);

    // Reference the response file.
    linkLibs = responseFlag;
    linkLibs += this->LocalGenerator->ConvertToOutputFormat(
      link_rsp, cmOutputConverter::SHELL);
  }
}